

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O2

TemplateDictionary * MakeDictionary(int i)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  TemplateString TVar17;
  TemplateString TVar18;
  TemplateString TVar19;
  TemplateString TVar20;
  TemplateString TVar21;
  TemplateString TVar22;
  TemplateString TVar23;
  TemplateString TVar24;
  TemplateString TVar25;
  TemplateString TVar26;
  TemplateString TVar27;
  TemplateString TVar28;
  TemplateString TVar29;
  TemplateString TVar30;
  TemplateString TVar31;
  TemplateString TVar32;
  TemplateString TVar33;
  TemplateString TVar34;
  TemplateString TVar35;
  TemplateString TVar36;
  TemplateString TVar37;
  TemplateString TVar38;
  TemplateString TVar39;
  TemplateString TVar40;
  TemplateString TVar41;
  TemplateString TVar42;
  TemplateString TVar43;
  TemplateString TVar44;
  TemplateString TVar45;
  TemplateString TVar46;
  TemplateString TVar47;
  TemplateString TVar48;
  TemplateString TVar49;
  TemplateString TVar50;
  TemplateString TVar51;
  TemplateString TVar52;
  TemplateString TVar53;
  TemplateString TVar54;
  TemplateString TVar55;
  TemplateString TVar56;
  TemplateString TVar57;
  TemplateString TVar58;
  TemplateString TVar59;
  TemplateString TVar60;
  TemplateString TVar61;
  TemplateString TVar62;
  TemplateString TVar63;
  TemplateString TVar64;
  TemplateString TVar65;
  TemplateString TVar66;
  TemplateString TVar67;
  TemplateString TVar68;
  TemplateString TVar69;
  TemplateString TVar70;
  TemplateString TVar71;
  TemplateString TVar72;
  TemplateString TVar73;
  TemplateString TVar74;
  TemplateString TVar75;
  TemplateString TVar76;
  TemplateString TVar77;
  TemplateString TVar78;
  TemplateString TVar79;
  TemplateString TVar80;
  TemplateString TVar81;
  TemplateString TVar82;
  TemplateString TVar83;
  TemplateString TVar84;
  TemplateString TVar85;
  TemplateString TVar86;
  TemplateString TVar87;
  TemplateString TVar88;
  TemplateString TVar89;
  TemplateString TVar90;
  TemplateString TVar91;
  TemplateString TVar92;
  TemplateString TVar93;
  TemplateString TVar94;
  TemplateString TVar95;
  TemplateString TVar96;
  TemplateString TVar97;
  TemplateString TVar98;
  TemplateString TVar99;
  TemplateString TVar100;
  TemplateString TVar101;
  TemplateString TVar102;
  TemplateString TVar103;
  TemplateString TVar104;
  TemplateString TVar105;
  TemplateString TVar106;
  TemplateString TVar107;
  TemplateDictionary *this;
  TemplateModifier *pTVar108;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar109;
  TemplateString local_d50;
  TemplateString local_d30;
  char *local_d10;
  size_t sStack_d08;
  undefined1 local_d00;
  undefined7 uStack_cff;
  undefined8 uStack_cf8;
  TemplateString local_cf0;
  char *local_cd0;
  size_t sStack_cc8;
  undefined1 local_cc0;
  undefined7 uStack_cbf;
  TemplateId TStack_cb8;
  TemplateString local_cb0;
  TemplateString local_c90;
  TemplateString local_c70;
  TemplateString local_c50;
  TemplateString local_c30;
  TemplateString local_c10;
  TemplateString local_bf0;
  TemplateString local_bd0;
  TemplateString local_bb0;
  TemplateString local_b90;
  TemplateString local_b70;
  TemplateString local_b50;
  TemplateString local_b30;
  TemplateString local_b10;
  TemplateString local_af0;
  TemplateString local_ad0;
  TemplateString local_ab0;
  TemplateString local_a90;
  TemplateString local_a70;
  TemplateString local_a50;
  TemplateString local_a30;
  TemplateString local_a10;
  TemplateString local_9f0;
  TemplateString local_9d0;
  TemplateString local_9b0;
  TemplateString local_990;
  TemplateString local_970;
  TemplateString local_950;
  TemplateString local_930;
  TemplateString local_910;
  TemplateString local_8f0;
  TemplateString local_8d0;
  TemplateString local_8b0;
  TemplateString local_890;
  TemplateString local_870;
  TemplateString local_850;
  TemplateString local_830;
  TemplateString local_810;
  TemplateString local_7f0;
  TemplateString local_7d0;
  TemplateString local_7b0;
  TemplateString local_790;
  TemplateString local_770;
  TemplateString local_750;
  TemplateString local_730;
  TemplateString local_710;
  TemplateString local_6f0;
  TemplateString local_6d0;
  TemplateString local_6b0;
  TemplateString local_690;
  TemplateString local_670;
  TemplateString local_650;
  TemplateString local_630;
  TemplateString local_610;
  TemplateString local_5f0;
  TemplateString local_5d0;
  TemplateString local_5b0;
  TemplateString local_590;
  TemplateString local_570;
  TemplateString local_550;
  TemplateString local_530;
  TemplateString local_510;
  TemplateString local_4f0;
  TemplateString local_4d0;
  TemplateString local_4b0;
  TemplateString local_490;
  TemplateString local_470;
  TemplateString local_450;
  TemplateString local_430;
  TemplateString local_410;
  TemplateString local_3f0;
  TemplateString local_3d0;
  TemplateString local_3b0;
  TemplateString local_390;
  TemplateString local_370;
  TemplateString local_350;
  TemplateString local_330;
  TemplateString local_310;
  TemplateString local_2f0;
  TemplateString local_2d0;
  TemplateString local_2b0;
  TemplateString local_290;
  TemplateString local_270;
  TemplateString local_250;
  TemplateString local_230;
  TemplateString local_210;
  TemplateString local_1f0;
  TemplateString local_1d0;
  TemplateString local_1b0;
  TemplateString local_190;
  TemplateString local_170;
  TemplateString local_150;
  TemplateString local_130;
  TemplateString local_110;
  TemplateString local_f0;
  TemplateString local_d0;
  TemplateString local_b0;
  TemplateString local_90;
  TemplateString local_70;
  TemplateString local_50;
  
  if (i == 3) {
    this = (TemplateDictionary *)operator_new(0x70);
    ctemplate::TemplateString::TemplateString(&local_d50,"dict3");
    ctemplate::TemplateDictionary::TemplateDictionary(this,&local_d50,(UnsafeArena *)0x0);
    ctemplate::TemplateString::TemplateString(&local_d50,"HEAD");
    ctemplate::TemplateString::TemplateString(&local_b50,"   ");
    TVar47.length_._0_4_ = (int)local_d50.length_;
    TVar47.ptr_ = local_d50.ptr_;
    TVar47.length_._4_4_ = (int)(local_d50.length_ >> 0x20);
    TVar47._16_4_ = local_d50._16_4_;
    TVar47._20_4_ = local_d50._20_4_;
    TVar47.id_._0_4_ = (int)local_d50.id_;
    TVar47.id_._4_4_ = (int)(local_d50.id_ >> 0x20);
    TVar87.length_ = local_b50.length_;
    TVar87.ptr_ = local_b50.ptr_;
    TVar87.is_immutable_ = local_b50.is_immutable_;
    TVar87._17_7_ = local_b50._17_7_;
    TVar87.id_ = local_b50.id_;
    ctemplate::TemplateDictionary::SetValue(TVar47,TVar87);
    ctemplate::TemplateString::TemplateString(&local_b70,"BODY");
    ctemplate::TemplateString::TemplateString(&local_b90,"\r\n");
    TVar48.length_._0_4_ = (int)local_b70.length_;
    TVar48.ptr_ = local_b70.ptr_;
    TVar48.length_._4_4_ = (int)(local_b70.length_ >> 0x20);
    TVar48._16_4_ = local_b70._16_4_;
    TVar48._20_4_ = local_b70._20_4_;
    TVar48.id_._0_4_ = (int)local_b70.id_;
    TVar48.id_._4_4_ = (int)(local_b70.id_ >> 0x20);
    TVar88.length_ = local_b90.length_;
    TVar88.ptr_ = local_b90.ptr_;
    TVar88.is_immutable_ = local_b90.is_immutable_;
    TVar88._17_7_ = local_b90._17_7_;
    TVar88.id_ = local_b90.id_;
    ctemplate::TemplateDictionary::SetValue(TVar48,TVar88);
  }
  else if (i == 2) {
    this = (TemplateDictionary *)operator_new(0x70);
    ctemplate::TemplateString::TemplateString(&local_d50,"dict2");
    ctemplate::TemplateDictionary::TemplateDictionary(this,&local_d50,(UnsafeArena *)0x0);
  }
  else {
    if (i != 1) {
      printf("%s: %d: ASSERT FAILED: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
             ,0x17a,"false");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                    ,0x17a,"TemplateDictionary *MakeDictionary(int)");
    }
    this = (TemplateDictionary *)operator_new(0x70);
    ctemplate::TemplateString::TemplateString(&local_d50,"dict1");
    ctemplate::TemplateDictionary::TemplateDictionary(this,&local_d50,(UnsafeArena *)0x0);
    ctemplate::TemplateString::TemplateString
              (&local_d50,"just used for debugging, so doesn\'t matter.txt");
    TVar1.length_._0_4_ = (int)local_d50.length_;
    TVar1.ptr_ = local_d50.ptr_;
    TVar1.length_._4_4_ = (int)(local_d50.length_ >> 0x20);
    TVar1._16_4_ = local_d50._16_4_;
    TVar1._20_4_ = local_d50._20_4_;
    TVar1.id_._0_4_ = (int)local_d50.id_;
    TVar1.id_._4_4_ = (int)(local_d50.id_ >> 0x20);
    ctemplate::TemplateDictionary::SetFilename(TVar1);
    ctemplate::TemplateString::TemplateString(&local_b50,"HEAD");
    ctemplate::TemplateString::TemplateString(&local_b70,"   This is the head   ");
    TVar2.length_._0_4_ = (int)local_b50.length_;
    TVar2.ptr_ = local_b50.ptr_;
    TVar2.length_._4_4_ = (int)(local_b50.length_ >> 0x20);
    TVar2._16_4_ = local_b50._16_4_;
    TVar2._20_4_ = local_b50._20_4_;
    TVar2.id_._0_4_ = (int)local_b50.id_;
    TVar2.id_._4_4_ = (int)(local_b50.id_ >> 0x20);
    TVar69.length_ = local_b70.length_;
    TVar69.ptr_ = local_b70.ptr_;
    TVar69.is_immutable_ = local_b70.is_immutable_;
    TVar69._17_7_ = local_b70._17_7_;
    TVar69.id_ = local_b70.id_;
    ctemplate::TemplateDictionary::SetValue(TVar2,TVar69);
    ctemplate::TemplateString::TemplateString(&local_b90,"FOOTER_BAR_TEXT");
    TVar3.length_._0_4_ = (int)local_b90.length_;
    TVar3.ptr_ = local_b90.ptr_;
    TVar3.length_._4_4_ = (int)(local_b90.length_ >> 0x20);
    TVar3._16_4_ = local_b90._16_4_;
    TVar3._20_4_ = local_b90._20_4_;
    TVar3.id_._0_4_ = (int)local_b90.id_;
    TVar3.id_._4_4_ = (int)(local_b90.id_ >> 0x20);
    pTVar108 = (TemplateModifier *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar3);
    ctemplate::TemplateString::TemplateString(&local_50,"BODY");
    ctemplate::TemplateString::TemplateString(&local_70,"Should never be shown");
    TVar4.length_._0_4_ = (int)local_50.length_;
    TVar4.ptr_ = local_50.ptr_;
    TVar4.length_._4_4_ = (int)(local_50.length_ >> 0x20);
    TVar4._16_4_ = local_50._16_4_;
    TVar4._20_4_ = local_50._20_4_;
    TVar4.id_._0_4_ = (int)local_50.id_;
    TVar4.id_._4_4_ = (int)(local_50.id_ >> 0x20);
    TVar70.length_ = local_70.length_;
    TVar70.ptr_ = local_70.ptr_;
    TVar70.is_immutable_ = local_70.is_immutable_;
    TVar70._17_7_ = local_70._17_7_;
    TVar70.id_ = local_70.id_;
    ctemplate::TemplateDictionary::SetValue(TVar4,TVar70);
    ctemplate::TemplateString::TemplateString(&local_90,"HOME_LINK");
    ctemplate::TemplateString::TemplateString(&local_b0,"<b>Time to go home!</b>");
    TVar5.length_._0_4_ = (int)local_90.length_;
    TVar5.ptr_ = local_90.ptr_;
    TVar5.length_._4_4_ = (int)(local_90.length_ >> 0x20);
    TVar5._16_4_ = local_90._16_4_;
    TVar5._20_4_ = local_90._20_4_;
    TVar5.id_._0_4_ = (int)local_90.id_;
    TVar5.id_._4_4_ = (int)(local_90.id_ >> 0x20);
    TVar71.length_ = local_b0.length_;
    TVar71.ptr_ = local_b0.ptr_;
    TVar71.is_immutable_ = local_b0.is_immutable_;
    TVar71._17_7_ = local_b0._17_7_;
    TVar71.id_ = local_b0.id_;
    ctemplate::TemplateDictionary::SetEscapedValue(TVar5,TVar71,pTVar108);
    ctemplate::TemplateString::TemplateString(&local_d0,"ADVERTISE_LINK");
    ctemplate::TemplateDictionary::SetFormattedValue(pTVar108,"<b>Be advertiser #%d</b>",2);
    ctemplate::TemplateString::TemplateString(&local_f0,"ABOUT_GOOGLE_LINK");
    ctemplate::TemplateString::TemplateString(&local_110,"<A HREF=/>About Google!</A>");
    TVar6.length_._0_4_ = (int)local_f0.length_;
    TVar6.ptr_ = local_f0.ptr_;
    TVar6.length_._4_4_ = (int)(local_f0.length_ >> 0x20);
    TVar6._16_4_ = local_f0._16_4_;
    TVar6._20_4_ = local_f0._20_4_;
    TVar6.id_._0_4_ = (int)local_f0.id_;
    TVar6.id_._4_4_ = (int)(local_f0.id_ >> 0x20);
    TVar72.length_ = local_110.length_;
    TVar72.ptr_ = local_110.ptr_;
    TVar72.is_immutable_ = local_110.is_immutable_;
    TVar72._17_7_ = local_110._17_7_;
    TVar72.id_ = local_110.id_;
    ctemplate::TemplateDictionary::SetValue(TVar6,TVar72);
    ctemplate::TemplateString::TemplateString(&local_130,"PROMO_LICENSING_SECTION");
    TVar7.length_._0_4_ = (int)local_130.length_;
    TVar7.ptr_ = local_130.ptr_;
    TVar7.length_._4_4_ = (int)(local_130.length_ >> 0x20);
    TVar7._16_4_ = local_130._16_4_;
    TVar7._20_4_ = local_130._20_4_;
    TVar7.id_._0_4_ = (int)local_130.id_;
    TVar7.id_._4_4_ = (int)(local_130.id_ >> 0x20);
    ctemplate::TemplateDictionary::ShowSection(TVar7);
    ctemplate::TemplateString::TemplateString(&local_150,"PROMO_LICENSING_LINK");
    ctemplate::TemplateString::TemplateString(&local_170,"<A HREF=\'foo\'>");
    TVar8.length_._0_4_ = (int)local_150.length_;
    TVar8.ptr_ = local_150.ptr_;
    TVar8.length_._4_4_ = (int)(local_150.length_ >> 0x20);
    TVar8._16_4_ = local_150._16_4_;
    TVar8._20_4_ = local_150._20_4_;
    TVar8.id_._0_4_ = (int)local_150.id_;
    TVar8.id_._4_4_ = (int)(local_150.id_ >> 0x20);
    TVar73.length_ = local_170.length_;
    TVar73.ptr_ = local_170.ptr_;
    TVar73.is_immutable_ = local_170.is_immutable_;
    TVar73._17_7_ = local_170._17_7_;
    TVar73.id_ = local_170.id_;
    ctemplate::TemplateDictionary::SetValue(TVar8,TVar73);
    ctemplate::TemplateString::TemplateString(&local_190,"TRIM_LINE_COLOR");
    ctemplate::TemplateString::TemplateString(&local_1b0,"Who cares?");
    TVar9.length_._0_4_ = (int)local_190.length_;
    TVar9.ptr_ = local_190.ptr_;
    TVar9.length_._4_4_ = (int)(local_190.length_ >> 0x20);
    TVar9._16_4_ = local_190._16_4_;
    TVar9._20_4_ = local_190._20_4_;
    TVar9.id_._0_4_ = (int)local_190.id_;
    TVar9.id_._4_4_ = (int)(local_190.id_ >> 0x20);
    TVar74.length_ = local_1b0.length_;
    TVar74.ptr_ = local_1b0.ptr_;
    TVar74.is_immutable_ = local_1b0.is_immutable_;
    TVar74._17_7_ = local_1b0._17_7_;
    TVar74.id_ = local_1b0.id_;
    ctemplate::TemplateDictionary::SetValue(TVar9,TVar74);
    ctemplate::TemplateString::TemplateString(&local_1d0,"TRIM_LINE_HEIGHT");
    TVar10.length_._0_4_ = (int)local_1d0.length_;
    TVar10.ptr_ = local_1d0.ptr_;
    TVar10.length_._4_4_ = (int)(local_1d0.length_ >> 0x20);
    TVar10._16_4_ = local_1d0._16_4_;
    TVar10._20_4_ = local_1d0._20_4_;
    TVar10.id_._0_4_ = (int)local_1d0.id_;
    TVar10.id_._4_4_ = (int)(local_1d0.id_ >> 0x20);
    ctemplate::TemplateDictionary::SetIntValue(TVar10,(long)this);
    ctemplate::TemplateString::TemplateString(&local_1f0,"MODIFIED_BY_GOOGLE");
    TVar11.length_._0_4_ = (int)local_1f0.length_;
    TVar11.ptr_ = local_1f0.ptr_;
    TVar11.length_._4_4_ = (int)(local_1f0.length_ >> 0x20);
    TVar11._16_4_ = local_1f0._16_4_;
    TVar11._20_4_ = local_1f0._20_4_;
    TVar11.id_._0_4_ = (int)local_1f0.id_;
    TVar11.id_._4_4_ = (int)(local_1f0.id_ >> 0x20);
    ctemplate::TemplateDictionary::SetIntValue(TVar11,(long)this);
    ctemplate::TemplateString::TemplateString(&local_210,"MSG_copyright");
    ctemplate::TemplateString::TemplateString(&local_230,"&copy; Google Inc. (all rights reserved)")
    ;
    TVar12.length_._0_4_ = (int)local_210.length_;
    TVar12.ptr_ = local_210.ptr_;
    TVar12.length_._4_4_ = (int)(local_210.length_ >> 0x20);
    TVar12._16_4_ = local_210._16_4_;
    TVar12._20_4_ = local_210._20_4_;
    TVar12.id_._0_4_ = (int)local_210.id_;
    TVar12.id_._4_4_ = (int)(local_210.id_ >> 0x20);
    TVar75.length_ = local_230.length_;
    TVar75.ptr_ = local_230.ptr_;
    TVar75.is_immutable_ = local_230.is_immutable_;
    TVar75._17_7_ = local_230._17_7_;
    TVar75.id_ = local_230.id_;
    ctemplate::TemplateDictionary::SetValue(TVar12,TVar75);
    ctemplate::TemplateString::TemplateString(&local_250,"CLOSING_DIV_SECTION");
    TVar13.length_._0_4_ = (int)local_250.length_;
    TVar13.ptr_ = local_250.ptr_;
    TVar13.length_._4_4_ = (int)(local_250.length_ >> 0x20);
    TVar13._16_4_ = local_250._16_4_;
    TVar13._20_4_ = local_250._20_4_;
    TVar13.id_._0_4_ = (int)local_250.id_;
    TVar13.id_._4_4_ = (int)(local_250.id_ >> 0x20);
    ctemplate::TemplateDictionary::ShowSection(TVar13);
    ctemplate::TemplateString::TemplateString(&local_270,"LATENCY_PREFETCH_URL");
    ctemplate::TemplateString::TemplateString(&local_290,"/huh?");
    ctemplate::TemplateString::TemplateString(&local_2b0,"UNUSED_SECTION_NAME");
    TVar14.length_._0_4_ = (int)local_270.length_;
    TVar14.ptr_ = local_270.ptr_;
    TVar14.length_._4_4_ = (int)(local_270.length_ >> 0x20);
    TVar14._16_4_ = local_270._16_4_;
    TVar14._20_4_ = local_270._20_4_;
    TVar14.id_._0_4_ = (int)local_270.id_;
    TVar14.id_._4_4_ = (int)(local_270.id_ >> 0x20);
    TVar76.length_ = local_290.length_;
    TVar76.ptr_ = local_290.ptr_;
    TVar76.is_immutable_ = local_290.is_immutable_;
    TVar76._17_7_ = local_290._17_7_;
    TVar76.id_ = local_290.id_;
    TVar105.length_ = local_2b0.length_;
    TVar105.ptr_ = local_2b0.ptr_;
    TVar105.is_immutable_ = local_2b0.is_immutable_;
    TVar105._17_7_ = local_2b0._17_7_;
    TVar105.id_ = local_2b0.id_;
    ctemplate::TemplateDictionary::SetValueAndShowSection(TVar14,TVar76,TVar105);
    ctemplate::TemplateString::TemplateString(&local_bf0,"LATENCY_PREFETCH_URL");
    std::__cxx11::string::string((string *)&local_cf0,"/latency",(allocator *)&local_bb0);
    local_cd0 = local_cf0.ptr_;
    sStack_cc8 = local_cf0.length_;
    local_cc0 = 0;
    TStack_cb8 = 0;
    ctemplate::TemplateString::TemplateString(&local_c10,"LATENCY_PREFETCH");
    TVar77._17_7_ = uStack_cbf;
    TVar77.is_immutable_ = (bool)local_cc0;
    TVar15.length_._0_4_ = (int)local_bf0.length_;
    TVar15.ptr_ = local_bf0.ptr_;
    TVar15.length_._4_4_ = (int)(local_bf0.length_ >> 0x20);
    TVar15._16_4_ = local_bf0._16_4_;
    TVar15._20_4_ = local_bf0._20_4_;
    TVar15.id_._0_4_ = (int)local_bf0.id_;
    TVar15.id_._4_4_ = (int)(local_bf0.id_ >> 0x20);
    TVar77.length_ = sStack_cc8;
    TVar77.ptr_ = local_cd0;
    TVar77.id_ = TStack_cb8;
    TVar106.length_ = local_c10.length_;
    TVar106.ptr_ = local_c10.ptr_;
    TVar106.is_immutable_ = local_c10.is_immutable_;
    TVar106._17_7_ = local_c10._17_7_;
    TVar106.id_ = local_c10.id_;
    ctemplate::TemplateDictionary::SetValueAndShowSection(TVar15,TVar77,TVar106);
    std::__cxx11::string::~string((string *)&local_cf0);
    ctemplate::TemplateString::TemplateString(&local_cf0,"JAVASCRIPT_FOOTER_SECTION");
    TVar16.length_._0_4_ = (int)local_cf0.length_;
    TVar16.ptr_ = local_cf0.ptr_;
    TVar16.length_._4_4_ = (int)(local_cf0.length_ >> 0x20);
    TVar16._16_4_ = local_cf0._16_4_;
    TVar16._20_4_ = local_cf0._20_4_;
    TVar16.id_._0_4_ = (int)local_cf0.id_;
    TVar16.id_._4_4_ = (int)(local_cf0.id_ >> 0x20);
    ctemplate::TemplateDictionary::AddSectionDictionary(TVar16);
    ctemplate::TemplateString::TemplateString(&local_bb0,"FAST_NEXT_JAVASCRIPT");
    TVar17.length_._0_4_ = (int)local_bb0.length_;
    TVar17.ptr_ = local_bb0.ptr_;
    TVar17.length_._4_4_ = (int)(local_bb0.length_ >> 0x20);
    TVar17._16_4_ = local_bb0._16_4_;
    TVar17._20_4_ = local_bb0._20_4_;
    TVar17.id_._0_4_ = (int)local_bb0.id_;
    TVar17.id_._4_4_ = (int)(local_bb0.id_ >> 0x20);
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar17);
    ctemplate::TemplateString::TemplateString(&local_2d0,"template_unittest_test_simple.in");
    TVar18.length_._0_4_ = (int)local_2d0.length_;
    TVar18.ptr_ = local_2d0.ptr_;
    TVar18.length_._4_4_ = (int)(local_2d0.length_ >> 0x20);
    TVar18._16_4_ = local_2d0._16_4_;
    TVar18._20_4_ = local_2d0._20_4_;
    TVar18.id_._0_4_ = (int)local_2d0.id_;
    TVar18.id_._4_4_ = (int)(local_2d0.id_ >> 0x20);
    ctemplate::TemplateDictionary::SetFilename(TVar18);
    ctemplate::TemplateString::TemplateString(&local_2f0,"FAST_NEXT_JAVASCRIPT");
    TVar19.length_._0_4_ = (int)local_2f0.length_;
    TVar19.ptr_ = local_2f0.ptr_;
    TVar19.length_._4_4_ = (int)(local_2f0.length_ >> 0x20);
    TVar19._16_4_ = local_2f0._16_4_;
    TVar19._20_4_ = local_2f0._20_4_;
    TVar19.id_._0_4_ = (int)local_2f0.id_;
    TVar19.id_._4_4_ = (int)(local_2f0.id_ >> 0x20);
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar19);
    ctemplate::TemplateString::TemplateString(&local_310,INVALID1_FN);
    TVar20.length_._0_4_ = (int)local_310.length_;
    TVar20.ptr_ = local_310.ptr_;
    TVar20.length_._4_4_ = (int)(local_310.length_ >> 0x20);
    TVar20._16_4_ = local_310._16_4_;
    TVar20._20_4_ = local_310._20_4_;
    TVar20.id_._0_4_ = (int)local_310.id_;
    TVar20.id_._4_4_ = (int)(local_310.id_ >> 0x20);
    ctemplate::TemplateDictionary::SetFilename(TVar20);
    ctemplate::TemplateString::TemplateString(&local_330,"FAST_NEXT_JAVASCRIPT");
    TVar21.length_._0_4_ = (int)local_330.length_;
    TVar21.ptr_ = local_330.ptr_;
    TVar21.length_._4_4_ = (int)(local_330.length_ >> 0x20);
    TVar21._16_4_ = local_330._16_4_;
    TVar21._20_4_ = local_330._20_4_;
    TVar21.id_._0_4_ = (int)local_330.id_;
    TVar21.id_._4_4_ = (int)(local_330.id_ >> 0x20);
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar21);
    ctemplate::TemplateString::TemplateString(&local_350,"template_unittest_test_simple.in");
    TVar22.length_._0_4_ = (int)local_350.length_;
    TVar22.ptr_ = local_350.ptr_;
    TVar22.length_._4_4_ = (int)(local_350.length_ >> 0x20);
    TVar22._16_4_ = local_350._16_4_;
    TVar22._20_4_ = local_350._20_4_;
    TVar22.id_._0_4_ = (int)local_350.id_;
    TVar22.id_._4_4_ = (int)(local_350.id_ >> 0x20);
    ctemplate::TemplateDictionary::SetFilename(TVar22);
    ctemplate::TemplateString::TemplateString(&local_370,"HEAD");
    ctemplate::TemplateString::TemplateString(&local_390,"head");
    TVar23.length_._0_4_ = (int)local_370.length_;
    TVar23.ptr_ = local_370.ptr_;
    TVar23.length_._4_4_ = (int)(local_370.length_ >> 0x20);
    TVar23._16_4_ = local_370._16_4_;
    TVar23._20_4_ = local_370._20_4_;
    TVar23.id_._0_4_ = (int)local_370.id_;
    TVar23.id_._4_4_ = (int)(local_370.id_ >> 0x20);
    TVar78.length_ = local_390.length_;
    TVar78.ptr_ = local_390.ptr_;
    TVar78.is_immutable_ = local_390.is_immutable_;
    TVar78._17_7_ = local_390._17_7_;
    TVar78.id_ = local_390.id_;
    ctemplate::TemplateDictionary::SetValue(TVar23,TVar78);
    ctemplate::TemplateString::TemplateString(&local_3b0,"JAVASCRIPT_FOOTER_SECTION");
    TVar24.length_._0_4_ = (int)local_3b0.length_;
    TVar24.ptr_ = local_3b0.ptr_;
    TVar24.length_._4_4_ = (int)(local_3b0.length_ >> 0x20);
    TVar24._16_4_ = local_3b0._16_4_;
    TVar24._20_4_ = local_3b0._20_4_;
    TVar24.id_._0_4_ = (int)local_3b0.id_;
    TVar24.id_._4_4_ = (int)(local_3b0.id_ >> 0x20);
    ctemplate::TemplateDictionary::AddSectionDictionary(TVar24);
    ctemplate::TemplateString::TemplateString(&local_3d0,"FAST_NEXT_JAVASCRIPT");
    TVar25.length_._0_4_ = (int)local_3d0.length_;
    TVar25.ptr_ = local_3d0.ptr_;
    TVar25.length_._4_4_ = (int)(local_3d0.length_ >> 0x20);
    TVar25._16_4_ = local_3d0._16_4_;
    TVar25._20_4_ = local_3d0._20_4_;
    TVar25.id_._0_4_ = (int)local_3d0.id_;
    TVar25.id_._4_4_ = (int)(local_3d0.id_ >> 0x20);
    pTVar108 = (TemplateModifier *)ctemplate::TemplateDictionary::AddIncludeDictionary(TVar25);
    ctemplate::TemplateString::TemplateString(&local_3f0,"template_unittest_test_simple.in");
    TVar26.length_._0_4_ = (int)local_3f0.length_;
    TVar26.ptr_ = local_3f0.ptr_;
    TVar26.length_._4_4_ = (int)(local_3f0.length_ >> 0x20);
    TVar26._16_4_ = local_3f0._16_4_;
    TVar26._20_4_ = local_3f0._20_4_;
    TVar26.id_._0_4_ = (int)local_3f0.id_;
    TVar26.id_._4_4_ = (int)(local_3f0.id_ >> 0x20);
    ctemplate::TemplateDictionary::SetFilename(TVar26);
    ctemplate::TemplateString::TemplateString(&local_410,"HEAD");
    ctemplate::TemplateString::TemplateString(&local_430,"include-head");
    TVar27.length_._0_4_ = (int)local_410.length_;
    TVar27.ptr_ = local_410.ptr_;
    TVar27.length_._4_4_ = (int)(local_410.length_ >> 0x20);
    TVar27._16_4_ = local_410._16_4_;
    TVar27._20_4_ = local_410._20_4_;
    TVar27.id_._0_4_ = (int)local_410.id_;
    TVar27.id_._4_4_ = (int)(local_410.id_ >> 0x20);
    TVar79.length_ = local_430.length_;
    TVar79.ptr_ = local_430.ptr_;
    TVar79.is_immutable_ = local_430.is_immutable_;
    TVar79._17_7_ = local_430._17_7_;
    TVar79.id_ = local_430.id_;
    ctemplate::TemplateDictionary::SetValue(TVar27,TVar79);
    ctemplate::TemplateString::TemplateString(&local_450,"BODY");
    TVar28.length_._0_4_ = (int)local_450.length_;
    TVar28.ptr_ = local_450.ptr_;
    TVar28.length_._4_4_ = (int)(local_450.length_ >> 0x20);
    TVar28.is_immutable_ = local_450.is_immutable_;
    TVar28._17_3_ = local_450._17_3_;
    TVar28._20_4_ = local_450._20_4_;
    TVar28.id_._0_4_ = (undefined4)local_450.id_;
    TVar28.id_._4_4_ = local_450.id_._4_4_;
    ctemplate::TemplateDictionary::SetEscapedFormattedValue
              (TVar28,pTVar108,(char *)&ctemplate::html_escape,0x55555555,"<b>%s</b>: %.4f",
               "<A HREF=/>",in_R8,in_R9);
    ctemplate::TemplateString::TemplateString(&local_470,"BI_NEWLINE");
    ctemplate::TemplateString::TemplateString(&local_490,"");
    TVar29.length_._0_4_ = (int)local_470.length_;
    TVar29.ptr_ = local_470.ptr_;
    TVar29.length_._4_4_ = (int)(local_470.length_ >> 0x20);
    TVar29._16_4_ = local_470._16_4_;
    TVar29._20_4_ = local_470._20_4_;
    TVar29.id_._0_4_ = (int)local_470.id_;
    TVar29.id_._4_4_ = (int)(local_470.id_ >> 0x20);
    TVar80.length_ = local_490.length_;
    TVar80.ptr_ = local_490.ptr_;
    TVar80.is_immutable_ = local_490.is_immutable_;
    TVar80._17_7_ = local_490._17_7_;
    TVar80.id_ = local_490.id_;
    ctemplate::TemplateDictionary::SetValue(TVar29,TVar80);
    ctemplate::TemplateString::TemplateString(&local_4b0,"FAST_NEXT_JAVASCRIPT");
    TVar30.length_._0_4_ = (int)local_4b0.length_;
    TVar30.ptr_ = local_4b0.ptr_;
    TVar30.length_._4_4_ = (int)(local_4b0.length_ >> 0x20);
    TVar30._16_4_ = local_4b0._16_4_;
    TVar30._20_4_ = local_4b0._20_4_;
    TVar30.id_._0_4_ = (int)local_4b0.id_;
    TVar30.id_._4_4_ = (int)(local_4b0.id_ >> 0x20);
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar30);
    ctemplate::TemplateString::TemplateString(&local_4d0,"template_unittest_test_html.in");
    TVar31.length_._0_4_ = (int)local_4d0.length_;
    TVar31.ptr_ = local_4d0.ptr_;
    TVar31.length_._4_4_ = (int)(local_4d0.length_ >> 0x20);
    TVar31._16_4_ = local_4d0._16_4_;
    TVar31._20_4_ = local_4d0._20_4_;
    TVar31.id_._0_4_ = (int)local_4d0.id_;
    TVar31.id_._4_4_ = (int)(local_4d0.id_ >> 0x20);
    ctemplate::TemplateDictionary::SetFilename(TVar31);
    ctemplate::TemplateString::TemplateString(&local_4f0,"HEAD");
    ctemplate::TemplateString::TemplateString(&local_510,"should be ignored");
    TVar32.length_._0_4_ = (int)local_4f0.length_;
    TVar32.ptr_ = local_4f0.ptr_;
    TVar32.length_._4_4_ = (int)(local_4f0.length_ >> 0x20);
    TVar32._16_4_ = local_4f0._16_4_;
    TVar32._20_4_ = local_4f0._20_4_;
    TVar32.id_._0_4_ = (int)local_4f0.id_;
    TVar32.id_._4_4_ = (int)(local_4f0.id_ >> 0x20);
    TVar81.length_ = local_510.length_;
    TVar81.ptr_ = local_510.ptr_;
    TVar81.is_immutable_ = local_510.is_immutable_;
    TVar81._17_7_ = local_510._17_7_;
    TVar81.id_ = local_510.id_;
    ctemplate::TemplateDictionary::SetValue(TVar32,TVar81);
    ctemplate::TemplateString::TemplateString(&local_530,"FAST_NEXT_JAVASCRIPT");
    TVar33.length_._0_4_ = (int)local_530.length_;
    TVar33.ptr_ = local_530.ptr_;
    TVar33.length_._4_4_ = (int)(local_530.length_ >> 0x20);
    TVar33._16_4_ = local_530._16_4_;
    TVar33._20_4_ = local_530._20_4_;
    TVar33.id_._0_4_ = (int)local_530.id_;
    TVar33.id_._4_4_ = (int)(local_530.id_ >> 0x20);
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar33);
    ctemplate::TemplateString::TemplateString(&local_550,"DUMMY");
    ctemplate::TemplateString::TemplateString(&local_570,"");
    ctemplate::TemplateString::TemplateString(&local_590,"NO_MOUSEOVER_FUNCTIONS");
    TVar34.length_._0_4_ = (int)local_550.length_;
    TVar34.ptr_ = local_550.ptr_;
    TVar34.length_._4_4_ = (int)(local_550.length_ >> 0x20);
    TVar34._16_4_ = local_550._16_4_;
    TVar34._20_4_ = local_550._20_4_;
    TVar34.id_._0_4_ = (int)local_550.id_;
    TVar34.id_._4_4_ = (int)(local_550.id_ >> 0x20);
    TVar82.length_ = local_570.length_;
    TVar82.ptr_ = local_570.ptr_;
    TVar82.is_immutable_ = local_570.is_immutable_;
    TVar82._17_7_ = local_570._17_7_;
    TVar82.id_ = local_570.id_;
    TVar107.length_ = local_590.length_;
    TVar107.ptr_ = local_590.ptr_;
    TVar107.is_immutable_ = local_590.is_immutable_;
    TVar107._17_7_ = local_590._17_7_;
    TVar107.id_ = local_590.id_;
    ctemplate::TemplateDictionary::SetValueAndShowSection(TVar34,TVar82,TVar107);
    ctemplate::TemplateString::TemplateString(&local_5b0,"MOUSEOVER_FUNCTIONS");
    TVar35.length_._0_4_ = (int)local_5b0.length_;
    TVar35.ptr_ = local_5b0.ptr_;
    TVar35.length_._4_4_ = (int)(local_5b0.length_ >> 0x20);
    TVar35._16_4_ = local_5b0._16_4_;
    TVar35._20_4_ = local_5b0._20_4_;
    TVar35.id_._0_4_ = (int)local_5b0.id_;
    TVar35.id_._4_4_ = (int)(local_5b0.id_ >> 0x20);
    ctemplate::TemplateDictionary::ShowSection(TVar35);
    ctemplate::TemplateString::TemplateString(&local_5d0,"MOUSEOVER_JAVASCRIPT");
    TVar36.length_._0_4_ = (int)local_5d0.length_;
    TVar36.ptr_ = local_5d0.ptr_;
    TVar36.length_._4_4_ = (int)(local_5d0.length_ >> 0x20);
    TVar36._16_4_ = local_5d0._16_4_;
    TVar36._20_4_ = local_5d0._20_4_;
    TVar36.id_._0_4_ = (int)local_5d0.id_;
    TVar36.id_._4_4_ = (int)(local_5d0.id_ >> 0x20);
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar36);
    std::__cxx11::string::string((string *)&local_d30,"not_a_template",(allocator *)&local_bd0);
    local_d10 = local_d30.ptr_;
    sStack_d08 = local_d30.length_;
    local_d00 = 0;
    uStack_cf8 = 0;
    TVar37.length_._0_4_ = (int)local_d30.length_;
    TVar37.ptr_ = local_d30.ptr_;
    TVar37.length_._4_4_ = (int)(local_d30.length_ >> 0x20);
    TVar37._16_4_ = (int)uStack_cff << 8;
    TVar37._20_4_ = (int)((uint7)uStack_cff >> 0x18);
    TVar37.id_ = 0;
    ctemplate::TemplateDictionary::SetFilename(TVar37);
    std::__cxx11::string::~string((string *)&local_d30);
    ctemplate::TemplateString::TemplateString(&local_d30,"BI_NEWLINE");
    ctemplate::TemplateString::TemplateString(&local_bd0,"not gonna matter");
    TVar38.length_._0_4_ = (int)local_d30.length_;
    TVar38.ptr_ = local_d30.ptr_;
    TVar38.length_._4_4_ = (int)(local_d30.length_ >> 0x20);
    TVar38._16_4_ = local_d30._16_4_;
    TVar38._20_4_ = local_d30._20_4_;
    TVar38.id_._0_4_ = (int)local_d30.id_;
    TVar38.id_._4_4_ = (int)(local_d30.id_ >> 0x20);
    TVar83.length_ = local_bd0.length_;
    TVar83.ptr_ = local_bd0.ptr_;
    TVar83.is_immutable_ = local_bd0.is_immutable_;
    TVar83._17_7_ = local_bd0._17_7_;
    TVar83.id_ = local_bd0.id_;
    ctemplate::TemplateDictionary::SetValue(TVar38,TVar83);
    ctemplate::TemplateString::TemplateString(&local_5f0,"GOTO_MESSAGE");
    ctemplate::TemplateString::TemplateString(&local_610,"print \"Go home\"");
    TVar39.length_._0_4_ = (int)local_5f0.length_;
    TVar39.ptr_ = local_5f0.ptr_;
    TVar39.length_._4_4_ = (int)(local_5f0.length_ >> 0x20);
    TVar39._16_4_ = local_5f0._16_4_;
    TVar39._20_4_ = local_5f0._20_4_;
    TVar39.id_._0_4_ = (int)local_5f0.id_;
    TVar39.id_._4_4_ = (int)(local_5f0.id_ >> 0x20);
    TVar84.length_ = local_610.length_;
    TVar84.ptr_ = local_610.ptr_;
    TVar84.is_immutable_ = local_610.is_immutable_;
    TVar84._17_7_ = local_610._17_7_;
    TVar84.id_ = local_610.id_;
    ctemplate::TemplateDictionary::SetEscapedValue(TVar39,TVar84,(TemplateModifier *)this);
    ctemplate::TemplateString::TemplateString(&local_630,"UPDATE");
    ctemplate::TemplateString::TemplateString(&local_650,"monday & tuesday");
    TVar40.length_._0_4_ = (int)local_630.length_;
    TVar40.ptr_ = local_630.ptr_;
    TVar40.length_._4_4_ = (int)(local_630.length_ >> 0x20);
    TVar40._16_4_ = local_630._16_4_;
    TVar40._20_4_ = local_630._20_4_;
    TVar40.id_._0_4_ = (int)local_630.id_;
    TVar40.id_._4_4_ = (int)(local_630.id_ >> 0x20);
    TVar85.length_ = local_650.length_;
    TVar85.ptr_ = local_650.ptr_;
    TVar85.is_immutable_ = local_650.is_immutable_;
    TVar85._17_7_ = local_650._17_7_;
    TVar85.id_ = local_650.id_;
    ctemplate::TemplateDictionary::SetEscapedValue(TVar40,TVar85,(TemplateModifier *)this);
    ctemplate::TemplateString::TemplateString(&local_670,"UPDATE_SECTION");
    TVar41.length_._0_4_ = (int)local_670.length_;
    TVar41.ptr_ = local_670.ptr_;
    TVar41.length_._4_4_ = (int)(local_670.length_ >> 0x20);
    TVar41._16_4_ = local_670._16_4_;
    TVar41._20_4_ = local_670._20_4_;
    TVar41.id_._0_4_ = (int)local_670.id_;
    TVar41.id_._4_4_ = (int)(local_670.id_ >> 0x20);
    ctemplate::TemplateDictionary::ShowSection(TVar41);
    ctemplate::TemplateString::TemplateString(&local_690,"ALIGNMENT");
    ctemplate::TemplateString::TemplateString(&local_6b0,"\"right\"");
    TVar42.length_._0_4_ = (int)local_690.length_;
    TVar42.ptr_ = local_690.ptr_;
    TVar42.length_._4_4_ = (int)(local_690.length_ >> 0x20);
    TVar42._16_4_ = local_690._16_4_;
    TVar42._20_4_ = local_690._20_4_;
    TVar42.id_._0_4_ = (int)local_690.id_;
    TVar42.id_._4_4_ = (int)(local_690.id_ >> 0x20);
    TVar86.length_ = local_6b0.length_;
    TVar86.ptr_ = local_6b0.ptr_;
    TVar86.is_immutable_ = local_6b0.is_immutable_;
    TVar86._17_7_ = local_6b0._17_7_;
    TVar86.id_ = local_6b0.id_;
    ctemplate::TemplateDictionary::SetValue(TVar42,TVar86);
    for (uVar109 = 0; uVar109 != 3; uVar109 = uVar109 + 1) {
      ctemplate::TemplateString::TemplateString(&local_c30,"RESULTS");
      TVar43.length_._0_4_ = (int)local_c30.length_;
      TVar43.ptr_ = local_c30.ptr_;
      TVar43.length_._4_4_ = (int)(local_c30.length_ >> 0x20);
      TVar43._16_4_ = local_c30._16_4_;
      TVar43._20_4_ = local_c30._20_4_;
      TVar43.id_._0_4_ = (int)local_c30.id_;
      TVar43.id_._4_4_ = (int)(local_c30.id_ >> 0x20);
      pTVar108 = (TemplateModifier *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar43);
      if ((uVar109 & 1) == 0) {
        ctemplate::TemplateString::TemplateString(&local_c50,"WHITE_BG");
        TVar44.length_._0_4_ = (int)local_c50.length_;
        TVar44.ptr_ = local_c50.ptr_;
        TVar44.length_._4_4_ = (int)(local_c50.length_ >> 0x20);
        TVar44._16_4_ = local_c50._16_4_;
        TVar44._20_4_ = local_c50._20_4_;
        TVar44.id_._0_4_ = (int)local_c50.id_;
        TVar44.id_._4_4_ = (int)(local_c50.id_ >> 0x20);
        ctemplate::TemplateDictionary::ShowSection(TVar44);
      }
      ctemplate::TemplateString::TemplateString(&local_c70,"RESULT");
      ctemplate::TemplateDictionary::SetFormattedValue
                (pTVar108,"<&>\"result\" #%d\'&\'",uVar109 & 0xffffffff);
      ctemplate::TemplateString::TemplateString(&local_c90,"XML_RESULT");
      TVar45.ptr_._4_4_ = local_c90.ptr_._4_4_;
      TVar45.ptr_._0_4_ = local_c90.ptr_._0_4_;
      TVar45.length_._0_4_ = (undefined4)local_c90.length_;
      TVar45.length_._4_4_ = local_c90.length_._4_4_;
      TVar45.is_immutable_ = local_c90.is_immutable_;
      TVar45._17_3_ = local_c90._17_3_;
      TVar45._20_4_ = local_c90._20_4_;
      TVar45.id_._0_4_ = (undefined4)local_c90.id_;
      TVar45.id_._4_4_ = local_c90.id_._4_4_;
      ctemplate::TemplateDictionary::SetEscapedFormattedValue
                (TVar45,pTVar108,(char *)&ctemplate::xml_escape,"<&>\"result\" #%d\'&\'",
                 uVar109 & 0xffffffff,in_R8,in_R9);
      ctemplate::TemplateString::TemplateString(&local_cb0,"GOODNESS");
      TVar46.length_._0_4_ = (int)local_cb0.length_;
      TVar46.ptr_ = local_cb0.ptr_;
      TVar46.length_._4_4_ = (int)(local_cb0.length_ >> 0x20);
      TVar46._16_4_ = local_cb0._16_4_;
      TVar46._20_4_ = local_cb0._20_4_;
      TVar46.id_._0_4_ = (int)local_cb0.id_;
      TVar46.id_._4_4_ = (int)(local_cb0.id_ >> 0x20);
      ctemplate::TemplateDictionary::SetIntValue(TVar46,(long)pTVar108);
    }
    ctemplate::TemplateString::TemplateString(&local_6d0,"AE_TITLE_GOOD");
    ctemplate::TemplateString::TemplateString(&local_6f0,"Hello World!");
    TVar49.length_._0_4_ = (int)local_6d0.length_;
    TVar49.ptr_ = local_6d0.ptr_;
    TVar49.length_._4_4_ = (int)(local_6d0.length_ >> 0x20);
    TVar49._16_4_ = local_6d0._16_4_;
    TVar49._20_4_ = local_6d0._20_4_;
    TVar49.id_._0_4_ = (int)local_6d0.id_;
    TVar49.id_._4_4_ = (int)(local_6d0.id_ >> 0x20);
    TVar89.length_ = local_6f0.length_;
    TVar89.ptr_ = local_6f0.ptr_;
    TVar89.is_immutable_ = local_6f0.is_immutable_;
    TVar89._17_7_ = local_6f0._17_7_;
    TVar89.id_ = local_6f0.id_;
    ctemplate::TemplateDictionary::SetValue(TVar49,TVar89);
    ctemplate::TemplateString::TemplateString(&local_710,"AE_TITLE_BAD");
    ctemplate::TemplateString::TemplateString(&local_730,"Hello <script>alert(1)</script> World!");
    TVar50.length_._0_4_ = (int)local_710.length_;
    TVar50.ptr_ = local_710.ptr_;
    TVar50.length_._4_4_ = (int)(local_710.length_ >> 0x20);
    TVar50._16_4_ = local_710._16_4_;
    TVar50._20_4_ = local_710._20_4_;
    TVar50.id_._0_4_ = (int)local_710.id_;
    TVar50.id_._4_4_ = (int)(local_710.id_ >> 0x20);
    TVar90.length_ = local_730.length_;
    TVar90.ptr_ = local_730.ptr_;
    TVar90.is_immutable_ = local_730.is_immutable_;
    TVar90._17_7_ = local_730._17_7_;
    TVar90.id_ = local_730.id_;
    ctemplate::TemplateDictionary::SetValue(TVar50,TVar90);
    ctemplate::TemplateString::TemplateString(&local_750,"AE_URL_GOOD");
    ctemplate::TemplateString::TemplateString(&local_770,"http://www.google.com/");
    TVar51.length_._0_4_ = (int)local_750.length_;
    TVar51.ptr_ = local_750.ptr_;
    TVar51.length_._4_4_ = (int)(local_750.length_ >> 0x20);
    TVar51._16_4_ = local_750._16_4_;
    TVar51._20_4_ = local_750._20_4_;
    TVar51.id_._0_4_ = (int)local_750.id_;
    TVar51.id_._4_4_ = (int)(local_750.id_ >> 0x20);
    TVar91.length_ = local_770.length_;
    TVar91.ptr_ = local_770.ptr_;
    TVar91.is_immutable_ = local_770.is_immutable_;
    TVar91._17_7_ = local_770._17_7_;
    TVar91.id_ = local_770.id_;
    ctemplate::TemplateDictionary::SetValue(TVar51,TVar91);
    ctemplate::TemplateString::TemplateString(&local_790,"AE_URL_BAD");
    ctemplate::TemplateString::TemplateString(&local_7b0,"javascript:alert(1)");
    TVar52.length_._0_4_ = (int)local_790.length_;
    TVar52.ptr_ = local_790.ptr_;
    TVar52.length_._4_4_ = (int)(local_790.length_ >> 0x20);
    TVar52._16_4_ = local_790._16_4_;
    TVar52._20_4_ = local_790._20_4_;
    TVar52.id_._0_4_ = (int)local_790.id_;
    TVar52.id_._4_4_ = (int)(local_790.id_ >> 0x20);
    TVar92.length_ = local_7b0.length_;
    TVar92.ptr_ = local_7b0.ptr_;
    TVar92.is_immutable_ = local_7b0.is_immutable_;
    TVar92._17_7_ = local_7b0._17_7_;
    TVar92.id_ = local_7b0.id_;
    ctemplate::TemplateDictionary::SetValue(TVar52,TVar92);
    ctemplate::TemplateString::TemplateString(&local_7d0,"AE_BG_COLOR_GOOD");
    ctemplate::TemplateString::TemplateString(&local_7f0,"red");
    TVar53.length_._0_4_ = (int)local_7d0.length_;
    TVar53.ptr_ = local_7d0.ptr_;
    TVar53.length_._4_4_ = (int)(local_7d0.length_ >> 0x20);
    TVar53._16_4_ = local_7d0._16_4_;
    TVar53._20_4_ = local_7d0._20_4_;
    TVar53.id_._0_4_ = (int)local_7d0.id_;
    TVar53.id_._4_4_ = (int)(local_7d0.id_ >> 0x20);
    TVar93.length_ = local_7f0.length_;
    TVar93.ptr_ = local_7f0.ptr_;
    TVar93.is_immutable_ = local_7f0.is_immutable_;
    TVar93._17_7_ = local_7f0._17_7_;
    TVar93.id_ = local_7f0.id_;
    ctemplate::TemplateDictionary::SetValue(TVar53,TVar93);
    ctemplate::TemplateString::TemplateString(&local_810,"AE_BG_COLOR_BAD");
    ctemplate::TemplateString::TemplateString(&local_830,"evil! &");
    TVar54.length_._0_4_ = (int)local_810.length_;
    TVar54.ptr_ = local_810.ptr_;
    TVar54.length_._4_4_ = (int)(local_810.length_ >> 0x20);
    TVar54._16_4_ = local_810._16_4_;
    TVar54._20_4_ = local_810._20_4_;
    TVar54.id_._0_4_ = (int)local_810.id_;
    TVar54.id_._4_4_ = (int)(local_810.id_ >> 0x20);
    TVar94.length_ = local_830.length_;
    TVar94.ptr_ = local_830.ptr_;
    TVar94.is_immutable_ = local_830.is_immutable_;
    TVar94._17_7_ = local_830._17_7_;
    TVar94.id_ = local_830.id_;
    ctemplate::TemplateDictionary::SetValue(TVar54,TVar94);
    ctemplate::TemplateString::TemplateString(&local_850,"AE_JS_GOOD");
    ctemplate::TemplateString::TemplateString(&local_870,"your text here");
    TVar55.length_._0_4_ = (int)local_850.length_;
    TVar55.ptr_ = local_850.ptr_;
    TVar55.length_._4_4_ = (int)(local_850.length_ >> 0x20);
    TVar55._16_4_ = local_850._16_4_;
    TVar55._20_4_ = local_850._20_4_;
    TVar55.id_._0_4_ = (int)local_850.id_;
    TVar55.id_._4_4_ = (int)(local_850.id_ >> 0x20);
    TVar95.length_ = local_870.length_;
    TVar95.ptr_ = local_870.ptr_;
    TVar95.is_immutable_ = local_870.is_immutable_;
    TVar95._17_7_ = local_870._17_7_;
    TVar95.id_ = local_870.id_;
    ctemplate::TemplateDictionary::SetValue(TVar55,TVar95);
    ctemplate::TemplateString::TemplateString(&local_890,"AE_JS_BAD");
    ctemplate::TemplateString::TemplateString(&local_8b0,"your text\'is clever\'thanks");
    TVar56.length_._0_4_ = (int)local_890.length_;
    TVar56.ptr_ = local_890.ptr_;
    TVar56.length_._4_4_ = (int)(local_890.length_ >> 0x20);
    TVar56._16_4_ = local_890._16_4_;
    TVar56._20_4_ = local_890._20_4_;
    TVar56.id_._0_4_ = (int)local_890.id_;
    TVar56.id_._4_4_ = (int)(local_890.id_ >> 0x20);
    TVar96.length_ = local_8b0.length_;
    TVar96.ptr_ = local_8b0.ptr_;
    TVar96.is_immutable_ = local_8b0.is_immutable_;
    TVar96._17_7_ = local_8b0._17_7_;
    TVar96.id_ = local_8b0.id_;
    ctemplate::TemplateDictionary::SetValue(TVar56,TVar96);
    ctemplate::TemplateString::TemplateString(&local_8d0,"AE_USERNAME_GOOD");
    ctemplate::TemplateString::TemplateString(&local_8f0,"Mr. Nice");
    TVar57.length_._0_4_ = (int)local_8d0.length_;
    TVar57.ptr_ = local_8d0.ptr_;
    TVar57.length_._4_4_ = (int)(local_8d0.length_ >> 0x20);
    TVar57._16_4_ = local_8d0._16_4_;
    TVar57._20_4_ = local_8d0._20_4_;
    TVar57.id_._0_4_ = (int)local_8d0.id_;
    TVar57.id_._4_4_ = (int)(local_8d0.id_ >> 0x20);
    TVar97.length_ = local_8f0.length_;
    TVar97.ptr_ = local_8f0.ptr_;
    TVar97.is_immutable_ = local_8f0.is_immutable_;
    TVar97._17_7_ = local_8f0._17_7_;
    TVar97.id_ = local_8f0.id_;
    ctemplate::TemplateDictionary::SetValue(TVar57,TVar97);
    ctemplate::TemplateString::TemplateString(&local_910,"AE_USERNAME_BAD");
    ctemplate::TemplateString::TemplateString(&local_930,"Doctor<script>alert(2)</script>Evil");
    TVar58.length_._0_4_ = (int)local_910.length_;
    TVar58.ptr_ = local_910.ptr_;
    TVar58.length_._4_4_ = (int)(local_910.length_ >> 0x20);
    TVar58._16_4_ = local_910._16_4_;
    TVar58._20_4_ = local_910._20_4_;
    TVar58.id_._0_4_ = (int)local_910.id_;
    TVar58.id_._4_4_ = (int)(local_910.id_ >> 0x20);
    TVar98.length_ = local_930.length_;
    TVar98.ptr_ = local_930.ptr_;
    TVar98.is_immutable_ = local_930.is_immutable_;
    TVar98._17_7_ = local_930._17_7_;
    TVar98.id_ = local_930.id_;
    ctemplate::TemplateDictionary::SetValue(TVar58,TVar98);
    ctemplate::TemplateString::TemplateString(&local_950,"AE_START_EDGE");
    ctemplate::TemplateString::TemplateString(&local_970,"left");
    TVar59.length_._0_4_ = (int)local_950.length_;
    TVar59.ptr_ = local_950.ptr_;
    TVar59.length_._4_4_ = (int)(local_950.length_ >> 0x20);
    TVar59._16_4_ = local_950._16_4_;
    TVar59._20_4_ = local_950._20_4_;
    TVar59.id_._0_4_ = (int)local_950.id_;
    TVar59.id_._4_4_ = (int)(local_950.id_ >> 0x20);
    TVar99.length_ = local_970.length_;
    TVar99.ptr_ = local_970.ptr_;
    TVar99.is_immutable_ = local_970.is_immutable_;
    TVar99._17_7_ = local_970._17_7_;
    TVar99.id_ = local_970.id_;
    ctemplate::TemplateDictionary::SetValue(TVar59,TVar99);
    ctemplate::TemplateString::TemplateString(&local_990,"AE_END_EDGE");
    ctemplate::TemplateString::TemplateString(&local_9b0,";:center()$$");
    TVar60.length_._0_4_ = (int)local_990.length_;
    TVar60.ptr_ = local_990.ptr_;
    TVar60.length_._4_4_ = (int)(local_990.length_ >> 0x20);
    TVar60._16_4_ = local_990._16_4_;
    TVar60._20_4_ = local_990._20_4_;
    TVar60.id_._0_4_ = (int)local_990.id_;
    TVar60.id_._4_4_ = (int)(local_990.id_ >> 0x20);
    TVar100.length_ = local_9b0.length_;
    TVar100.ptr_ = local_9b0.ptr_;
    TVar100.is_immutable_ = local_9b0.is_immutable_;
    TVar100._17_7_ = local_9b0._17_7_;
    TVar100.id_ = local_9b0.id_;
    ctemplate::TemplateDictionary::SetValue(TVar60,TVar100);
    ctemplate::TemplateString::TemplateString(&local_9d0,"AE_FONT_SIZE_PC");
    ctemplate::TemplateString::TemplateString(&local_9f0,"120%");
    TVar61.length_._0_4_ = (int)local_9d0.length_;
    TVar61.ptr_ = local_9d0.ptr_;
    TVar61.length_._4_4_ = (int)(local_9d0.length_ >> 0x20);
    TVar61._16_4_ = local_9d0._16_4_;
    TVar61._20_4_ = local_9d0._20_4_;
    TVar61.id_._0_4_ = (int)local_9d0.id_;
    TVar61.id_._4_4_ = (int)(local_9d0.id_ >> 0x20);
    TVar101.length_ = local_9f0.length_;
    TVar101.ptr_ = local_9f0.ptr_;
    TVar101.is_immutable_ = local_9f0.is_immutable_;
    TVar101._17_7_ = local_9f0._17_7_;
    TVar101.id_ = local_9f0.id_;
    ctemplate::TemplateDictionary::SetValue(TVar61,TVar101);
    ctemplate::TemplateString::TemplateString(&local_a10,"AE_FONT_SIZE_PT");
    ctemplate::TemplateString::TemplateString(&local_a30,"12pt");
    TVar62.length_._0_4_ = (int)local_a10.length_;
    TVar62.ptr_ = local_a10.ptr_;
    TVar62.length_._4_4_ = (int)(local_a10.length_ >> 0x20);
    TVar62._16_4_ = local_a10._16_4_;
    TVar62._20_4_ = local_a10._20_4_;
    TVar62.id_._0_4_ = (int)local_a10.id_;
    TVar62.id_._4_4_ = (int)(local_a10.id_ >> 0x20);
    TVar102.length_ = local_a30.length_;
    TVar102.ptr_ = local_a30.ptr_;
    TVar102.is_immutable_ = local_a30.is_immutable_;
    TVar102._17_7_ = local_a30._17_7_;
    TVar102.id_ = local_a30.id_;
    ctemplate::TemplateDictionary::SetValue(TVar62,TVar102);
    ctemplate::TemplateString::TemplateString(&local_a50,"AE_MAUVE_RGB");
    ctemplate::TemplateString::TemplateString(&local_a70,"#FF7BD5");
    TVar63.length_._0_4_ = (int)local_a50.length_;
    TVar63.ptr_ = local_a50.ptr_;
    TVar63.length_._4_4_ = (int)(local_a50.length_ >> 0x20);
    TVar63._16_4_ = local_a50._16_4_;
    TVar63._20_4_ = local_a50._20_4_;
    TVar63.id_._0_4_ = (int)local_a50.id_;
    TVar63.id_._4_4_ = (int)(local_a50.id_ >> 0x20);
    TVar103.length_ = local_a70.length_;
    TVar103.ptr_ = local_a70.ptr_;
    TVar103.is_immutable_ = local_a70.is_immutable_;
    TVar103._17_7_ = local_a70._17_7_;
    TVar103.id_ = local_a70.id_;
    ctemplate::TemplateDictionary::SetValue(TVar63,TVar103);
    ctemplate::TemplateString::TemplateString(&local_a90,"AE_ITALIC");
    ctemplate::TemplateString::TemplateString(&local_ab0,"italic");
    TVar64.length_._0_4_ = (int)local_a90.length_;
    TVar64.ptr_ = local_a90.ptr_;
    TVar64.length_._4_4_ = (int)(local_a90.length_ >> 0x20);
    TVar64._16_4_ = local_a90._16_4_;
    TVar64._20_4_ = local_a90._20_4_;
    TVar64.id_._0_4_ = (int)local_a90.id_;
    TVar64.id_._4_4_ = (int)(local_a90.id_ >> 0x20);
    TVar104.length_ = local_ab0.length_;
    TVar104.ptr_ = local_ab0.ptr_;
    TVar104.is_immutable_ = local_ab0.is_immutable_;
    TVar104._17_7_ = local_ab0._17_7_;
    TVar104.id_ = local_ab0.id_;
    ctemplate::TemplateDictionary::SetValue(TVar64,TVar104);
    ctemplate::TemplateString::TemplateString(&local_ad0,"FOOTER");
    TVar65.length_._0_4_ = (int)local_ad0.length_;
    TVar65.ptr_ = local_ad0.ptr_;
    TVar65.length_._4_4_ = (int)(local_ad0.length_ >> 0x20);
    TVar65._16_4_ = local_ad0._16_4_;
    TVar65._20_4_ = local_ad0._20_4_;
    TVar65.id_._0_4_ = (int)local_ad0.id_;
    TVar65.id_._4_4_ = (int)(local_ad0.id_ >> 0x20);
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar65);
    ctemplate::TemplateString::TemplateString(&local_af0,"template_unittest_test_footer.in");
    TVar66.length_._0_4_ = (int)local_af0.length_;
    TVar66.ptr_ = local_af0.ptr_;
    TVar66.length_._4_4_ = (int)(local_af0.length_ >> 0x20);
    TVar66._16_4_ = local_af0._16_4_;
    TVar66._20_4_ = local_af0._20_4_;
    TVar66.id_._0_4_ = (int)local_af0.id_;
    TVar66.id_._4_4_ = (int)(local_af0.id_ >> 0x20);
    ctemplate::TemplateDictionary::SetFilename(TVar66);
    ctemplate::TemplateString::TemplateString(&local_b10,"SIMPLE");
    TVar67.length_._0_4_ = (int)local_b10.length_;
    TVar67.ptr_ = local_b10.ptr_;
    TVar67.length_._4_4_ = (int)(local_b10.length_ >> 0x20);
    TVar67._16_4_ = local_b10._16_4_;
    TVar67._20_4_ = local_b10._20_4_;
    TVar67.id_._0_4_ = (int)local_b10.id_;
    TVar67.id_._4_4_ = (int)(local_b10.id_ >> 0x20);
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar67);
    ctemplate::TemplateString::TemplateString(&local_b30,"template_unittest_test_simple.in");
    TVar68.length_._0_4_ = (int)local_b30.length_;
    TVar68.ptr_ = local_b30.ptr_;
    TVar68.length_._4_4_ = (int)(local_b30.length_ >> 0x20);
    TVar68._16_4_ = local_b30._16_4_;
    TVar68._20_4_ = local_b30._20_4_;
    TVar68.id_._0_4_ = (int)local_b30.id_;
    TVar68.id_._4_4_ = (int)(local_b30.id_ >> 0x20);
    ctemplate::TemplateDictionary::SetFilename(TVar68);
  }
  return this;
}

Assistant:

static TemplateDictionary* MakeDictionary(int i) {
  switch (i) {
    case 1: return MakeDict1();
    case 2: return MakeDict2();
    case 3: return MakeDict3();
    default: ASSERT(false);  // No dictionary with this number yet.
  }
  return NULL;
}